

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

void Ifd_ManStop(Ifd_Man_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  Vec_Wrd_t *__ptr;
  uint uVar2;
  int i;
  
  i = 1;
  uVar2 = 0;
  while( true ) {
    p_00 = p->vMarks;
    if (p_00->nSize <= i) break;
    uVar1 = Vec_IntEntry(p_00,i);
    printf("%d(%d:%d) ",(ulong)(i - 1),(ulong)uVar1,(ulong)(uVar1 - uVar2));
    i = i + 1;
    uVar2 = uVar1;
  }
  putchar(10);
  Vec_IntFreeP(&p->vArgs);
  Vec_IntFreeP(&p->vRes);
  __ptr = p->vTruths;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      p->vTruths->pArray = (word *)0x0;
      __ptr = p->vTruths;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_0037f3eb;
    }
    free(__ptr);
    p->vTruths = (Vec_Wrd_t *)0x0;
  }
LAB_0037f3eb:
  Vec_IntFreeP(&p->vClauses);
  Vec_IntFreeP(&p->vMarks);
  Hsh_IntManStop(p->vHash);
  Vec_IntFreeP(&p->vSuper);
  free(p->pObjs);
  free(p);
  return;
}

Assistant:

void Ifd_ManStop( Ifd_Man_t * p )
{
    int i, This, Prev = 0;
    Vec_IntForEachEntryStart( p->vMarks, This, i, 1 )
    {
        printf( "%d(%d:%d) ", i-1, This, This - Prev );
        Prev = This;
    }
    printf( "\n" );

    Vec_IntFreeP( &p->vArgs );
    Vec_IntFreeP( &p->vRes );
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vMarks );
    Hsh_IntManStop( p->vHash );
    Vec_IntFreeP( &p->vSuper );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}